

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_jtalk.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"The Japanese TTS System \"Open JTalk\"\n");
  fprintf(_stderr,"Version 1.10 (http://open-jtalk.sourceforge.net/)\n");
  fprintf(_stderr,"Copyright (C) 2008-2016 Nagoya Institute of Technology\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"%s",
          "The HMM-Based Speech Synthesis Engine \"hts_engine API\"\nVersion 1.10 (http://hts-engine.sourceforge.net/)\nCopyright (C) 2001-2015 Nagoya Institute of Technology\n              2001-2008 Tokyo Institute of Technology\nAll rights reserved.\n"
         );
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Yet Another Part-of-Speech and Morphological Analyzer \"Mecab\"\n");
  fprintf(_stderr,"Version 0.996 (http://mecab.sourceforge.net/)\n");
  fprintf(_stderr,"Copyright (C) 2001-2008 Taku Kudo\n");
  fprintf(_stderr,"              2004-2008 Nippon Telegraph and Telephone Corporation\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"NAIST Japanese Dictionary\n");
  fprintf(_stderr,"Version 0.6.1-20090630 (http://naist-jdic.sourceforge.jp/)\n");
  fprintf(_stderr,"Copyright (C) 2009 Nara Institute of Science and Technology\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"UniDic\n");
  fprintf(_stderr,"Version 2.2.0 (https://unidic.ninjal.ac.jp/)\n");
  fprintf(_stderr,"Copyright (C) 2011-2017 The UniDic Consortium\n");
  fprintf(_stderr,"All rights reserved.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"open_jtalk - The Japanese TTS system \"Open JTalk\"\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"  usage:\n");
  fprintf(_stderr,"       open_jtalk [ options ] [ infile ] \n");
  fprintf(_stderr,
          "  options:                                                                   [  def][ min-- max]\n"
         );
  fprintf(_stderr,
          "    -x  dir        : dictionary directory                                    [  N/A]\n");
  fprintf(_stderr,
          "    -m  htsvoice   : HTS voice files                                         [  N/A]\n");
  fprintf(_stderr,
          "    -ow s          : filename of output wav audio (generated speech)         [  N/A]\n");
  fprintf(_stderr,
          "    -ot s          : filename of output trace information                    [  N/A]\n");
  fprintf(_stderr,
          "    -s  i          : sampling frequency                                      [ auto][   1--    ]\n"
         );
  fprintf(_stderr,
          "    -p  i          : frame period (point)                                    [ auto][   1--    ]\n"
         );
  fprintf(_stderr,
          "    -a  f          : all-pass constant                                       [ auto][ 0.0-- 1.0]\n"
         );
  fprintf(_stderr,
          "    -b  f          : postfiltering coefficient                               [  0.0][ 0.0-- 1.0]\n"
         );
  fprintf(_stderr,
          "    -r  f          : speech speed rate                                       [  1.0][ 0.0--    ]\n"
         );
  fprintf(_stderr,
          "    -fm f          : additional half-tone                                    [  0.0][    --    ]\n"
         );
  fprintf(_stderr,
          "    -u  f          : voiced/unvoiced threshold                               [  0.5][ 0.0-- 1.0]\n"
         );
  fprintf(_stderr,
          "    -jm f          : weight of GV for spectrum                               [  1.0][ 0.0--    ]\n"
         );
  fprintf(_stderr,
          "    -jf f          : weight of GV for log F0                                 [  1.0][ 0.0--    ]\n"
         );
  fprintf(_stderr,
          "    -g  f          : volume (dB)                                             [  0.0][    --    ]\n"
         );
  fprintf(_stderr,
          "    -z  i          : audio buffer size (if i==0, turn off)                   [    0][   0--    ]\n"
         );
  fprintf(_stderr,"  infile:\n");
  fprintf(_stderr,
          "    text file                                                                [stdin]\n");
  fprintf(_stderr,"\n");
  exit(0);
}

Assistant:

static void usage()
{
   fprintf(stderr, "The Japanese TTS System \"Open JTalk\"\n");
   fprintf(stderr, "Version 1.10 (http://open-jtalk.sourceforge.net/)\n");
   fprintf(stderr, "Copyright (C) 2008-2016 Nagoya Institute of Technology\n");
   fprintf(stderr, "All rights reserved.\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "%s", HTS_COPYRIGHT);
   fprintf(stderr, "\n");
   fprintf(stderr, "Yet Another Part-of-Speech and Morphological Analyzer \"Mecab\"\n");
   fprintf(stderr, "Version 0.996 (http://mecab.sourceforge.net/)\n");
   fprintf(stderr, "Copyright (C) 2001-2008 Taku Kudo\n");
   fprintf(stderr, "              2004-2008 Nippon Telegraph and Telephone Corporation\n");
   fprintf(stderr, "All rights reserved.\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "NAIST Japanese Dictionary\n");
   fprintf(stderr, "Version 0.6.1-20090630 (http://naist-jdic.sourceforge.jp/)\n");
   fprintf(stderr, "Copyright (C) 2009 Nara Institute of Science and Technology\n");
   fprintf(stderr, "All rights reserved.\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "UniDic\n");
   fprintf(stderr, "Version 2.2.0 (https://unidic.ninjal.ac.jp/)\n");
   fprintf(stderr, "Copyright (C) 2011-2017 The UniDic Consortium\n");
   fprintf(stderr, "All rights reserved.\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "open_jtalk - The Japanese TTS system \"Open JTalk\"\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "  usage:\n");
   fprintf(stderr, "       open_jtalk [ options ] [ infile ] \n");
   fprintf(stderr,
           "  options:                                                                   [  def][ min-- max]\n");
   fprintf(stderr,
           "    -x  dir        : dictionary directory                                    [  N/A]\n");
   fprintf(stderr,
           "    -m  htsvoice   : HTS voice files                                         [  N/A]\n");
   fprintf(stderr,
           "    -ow s          : filename of output wav audio (generated speech)         [  N/A]\n");
   fprintf(stderr,
           "    -ot s          : filename of output trace information                    [  N/A]\n");
   fprintf(stderr,
           "    -s  i          : sampling frequency                                      [ auto][   1--    ]\n");
   fprintf(stderr,
           "    -p  i          : frame period (point)                                    [ auto][   1--    ]\n");
   fprintf(stderr,
           "    -a  f          : all-pass constant                                       [ auto][ 0.0-- 1.0]\n");
   fprintf(stderr,
           "    -b  f          : postfiltering coefficient                               [  0.0][ 0.0-- 1.0]\n");
   fprintf(stderr,
           "    -r  f          : speech speed rate                                       [  1.0][ 0.0--    ]\n");
   fprintf(stderr,
           "    -fm f          : additional half-tone                                    [  0.0][    --    ]\n");
   fprintf(stderr,
           "    -u  f          : voiced/unvoiced threshold                               [  0.5][ 0.0-- 1.0]\n");
   fprintf(stderr,
           "    -jm f          : weight of GV for spectrum                               [  1.0][ 0.0--    ]\n");
   fprintf(stderr,
           "    -jf f          : weight of GV for log F0                                 [  1.0][ 0.0--    ]\n");
   fprintf(stderr,
           "    -g  f          : volume (dB)                                             [  0.0][    --    ]\n");
   fprintf(stderr,
           "    -z  i          : audio buffer size (if i==0, turn off)                   [    0][   0--    ]\n");
   fprintf(stderr, "  infile:\n");
   fprintf(stderr,
           "    text file                                                                [stdin]\n");
   fprintf(stderr, "\n");

   exit(0);
}